

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_ctx_open(nng_ctx *cp,nng_socket s)

{
  int iVar1;
  uint32_t uVar2;
  nng_ctx c;
  int rv;
  nni_ctx *ctx;
  nni_sock *sock;
  nng_ctx *cp_local;
  nng_socket s_local;
  
  sock = (nni_sock *)cp;
  cp_local._0_4_ = s.id;
  cp_local._4_4_ = nni_sock_find((nni_sock **)&ctx,s.id);
  if (cp_local._4_4_ == 0) {
    iVar1 = nni_ctx_open((nni_ctx **)&c,(nni_sock *)ctx);
    if (iVar1 == 0) {
      uVar2 = nni_ctx_id(_c);
      nni_ctx_rele(_c);
      nni_sock_rele((nni_sock *)ctx);
      *(uint32_t *)&(sock->s_node).ln_next = uVar2;
      cp_local._4_4_ = 0;
    }
    else {
      nni_sock_rele((nni_sock *)ctx);
      cp_local._4_4_ = iVar1;
    }
  }
  return cp_local._4_4_;
}

Assistant:

int
nng_ctx_open(nng_ctx *cp, nng_socket s)
{
	nni_sock *sock;
	nni_ctx  *ctx;
	int       rv;
	nng_ctx   c;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_ctx_open(&ctx, sock)) != 0) {
		nni_sock_rele(sock);
		return (rv);
	}
	c.id = nni_ctx_id(ctx);
	nni_ctx_rele(ctx);
	nni_sock_rele(sock);
	*cp = c;
	return (0);
}